

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatprint.c
# Opt level: O0

char * ec_soeerror2string(uint16 errorcode)

{
  bool bVar1;
  int local_10;
  int i;
  uint16 errorcode_local;
  
  local_10 = 0;
  while( true ) {
    bVar1 = false;
    if (ec_soeerrorlist[local_10].errorcode != 0xffff) {
      bVar1 = ec_soeerrorlist[local_10].errorcode != errorcode;
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  return ec_soeerrorlist[local_10].errordescription;
}

Assistant:

char* ec_soeerror2string( uint16 errorcode)
{
   int i = 0;

   while ( (ec_soeerrorlist[i].errorcode != 0xffff) && 
           (ec_soeerrorlist[i].errorcode != errorcode) ) 
   {
      i++;
   }
   
   return (char *) ec_soeerrorlist[i].errordescription;
}